

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_internal_entry.h
# Opt level: O1

int __thiscall ParallelManager::init(ParallelManager *this,EVP_PKEY_CTX *ctx)

{
  undefined8 uVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  if (this->m_init_done == false) {
    if (*(long *)(ctx + 0x10) == 0) {
      uVar1 = std::__throw_bad_function_call();
      pthread_mutex_unlock((pthread_mutex_t *)this);
      _Unwind_Resume(uVar1);
    }
    uVar3 = (**(code **)(ctx + 0x18))(ctx);
    this->m_task_count = uVar3;
    this->m_init_done = true;
  }
  iVar2 = pthread_mutex_unlock((pthread_mutex_t *)this);
  return iVar2;
}

Assistant:

void init(std::function<unsigned int(void)> init_func)
	{
		std::lock_guard<std::mutex> lck(m_lock);
		if (!m_init_done)
		{
			m_task_count = init_func();
			m_init_done = true;
		}
	}